

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  char **this_00;
  char *pcVar1;
  Name name;
  Name breakTo;
  bool bVar2;
  byte bVar3;
  ExpressionRunner<wasm::ModuleRunner> *pEVar4;
  long lVar5;
  Module *module;
  Literal *pLVar6;
  HeapType in_R8;
  Name NVar7;
  Name func_00;
  Literals local_1e0;
  pointer local_1a8;
  char *pcStack_1a0;
  Literals local_198;
  undefined1 local_159;
  size_t local_158;
  char *pcStack_150;
  char *local_140;
  pointer local_138;
  char *pcStack_130;
  Literal local_128;
  uintptr_t local_110;
  string_view local_108;
  undefined1 local_f8 [16];
  HeapType funcType;
  Function *func;
  undefined1 local_b8 [8];
  Flow flow;
  Literals arguments;
  Name target;
  Call *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(curr + 0x30);
  pcVar1 = *(char **)(curr + 0x38);
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_b8,pEVar4,(ExpressionList *)(curr + 0x10),(Literals *)this_00);
  bVar2 = Flow::breaking((Flow *)local_b8);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_b8);
  }
  else {
    funcType.id = *(uintptr_t *)(curr + 0x30);
    NVar7.super_IString.str._M_str = (char *)funcType.id;
    NVar7.super_IString.str._M_len = (size_t)this->wasm;
    lVar5 = ::wasm::Module::getFunction(NVar7);
    local_f8._8_8_ = *(uintptr_t *)(lVar5 + 0x38);
    pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    module = ExpressionRunner<wasm::ModuleRunner>::getModule(pEVar4);
    Intrinsics::Intrinsics((Intrinsics *)local_f8,module);
    bVar3 = ::wasm::Intrinsics::isCallWithoutEffects((Function *)local_f8);
    if ((bVar3 & 1) != 0) {
      pLVar6 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str)
      ;
      local_108 = (string_view)wasm::Literal::getFunc(pLVar6);
      Name::operator=((Name *)&arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(Name *)&local_108)
      ;
      pLVar6 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str)
      ;
      local_110 = (uintptr_t)Type::getHeapType(&pLVar6->type);
      local_f8._8_8_ = local_110;
      SmallVector<wasm::Literal,_1UL>::pop_back
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    }
    if (((byte)curr[0x40] & 1) == 0) {
      local_159 = 0;
      local_1a8 = arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      pcStack_1a0 = pcVar1;
      Literals::Literals(&local_1e0,(Literals *)&flow.breakTo.super_IString.str._M_str);
      name.super_IString.str._M_str = pcStack_1a0;
      name.super_IString.str._M_len = (size_t)local_1a8;
      callFunction(&local_198,this,name,&local_1e0);
      Flow::Flow(__return_storage_ptr__,&local_198);
      Literals::~Literals(&local_198);
      Literals::~Literals(&local_1e0);
      local_159 = 1;
    }
    else {
      local_138 = arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_140 = (char *)local_f8._8_8_;
      func_00.super_IString.str._M_str = (char *)local_f8._8_8_;
      func_00.super_IString.str._M_len = (size_t)pcVar1;
      pcStack_130 = pcVar1;
      wasm::Literal::makeFunc
                (&local_128,
                 arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,func_00,in_R8);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                 &local_128);
      ::wasm::Literal::~Literal(&local_128);
      local_158 = RETURN_CALL_FLOW;
      pcStack_150 = _bitmaskI8x16;
      breakTo.super_IString.str._M_str = _bitmaskI8x16;
      breakTo.super_IString.str._M_len = RETURN_CALL_FLOW;
      Flow::Flow(__return_storage_ptr__,breakTo,(Literals *)&flow.breakTo.super_IString.str._M_str);
    }
  }
  Flow::~Flow((Flow *)local_b8);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Name target = curr->target;
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    auto funcType = func->type;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      target = arguments.back().getFunc();
      funcType = arguments.back().type.getHeapType();
      arguments.pop_back();
    }

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      arguments.push_back(Literal::makeFunc(target, funcType));
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = callFunction(target, arguments);
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }